

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::socks5::on_name_lookup
          (socks5 *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *ips)

{
  alert_manager *paVar1;
  bool bVar2;
  const_iterator __last;
  error_category *cat;
  reference addr;
  socklen_t __len;
  error_code *peVar3;
  undefined1 local_1e0 [68];
  int local_19c;
  duration<long,std::ratio<1l,1l>> local_198 [8];
  duration<long,std::ratio<1l,1000000000l>> local_190 [24];
  undefined1 local_178 [32];
  type local_158;
  operation_t local_135;
  endpoint local_134;
  address local_118;
  undefined1 local_f4 [8];
  endpoint bind_ep;
  operation_t local_cd;
  tcp_keepalive_idle local_cc;
  operation_t local_c5;
  boolean<1,_9> local_c4;
  operation_t local_bd;
  char local_bc [4];
  undefined1 local_b8 [8];
  error_code ec;
  operation_t local_95;
  endpoint local_94;
  __normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
  local_78;
  socks5 *local_70;
  per_timer_data *local_68;
  undefined1 local_60 [16];
  __normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
  i;
  error_code local_30;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_20;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *ips_local;
  error_code *e_local;
  socks5 *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ips;
    ips_local = (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)e;
    e_local = (error_code *)this;
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_30,operation_aborted,(type *)0x0);
    bVar2 = boost::system::operator==(e,&local_30);
    if (!bVar2) {
      bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)ips_local);
      if (bVar2) {
        bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
        if (bVar2) {
          paVar1 = this->m_alerts;
          listen_socket_handle::get_local_endpoint
                    ((endpoint *)((long)&i._M_current + 4),&this->m_listen_socket);
          i._M_current._3_1_ = 0x26;
          alert_manager::
          emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::operation_t,boost::system::error_code_const&>
                    (paVar1,(basic_endpoint<boost::asio::ip::tcp> *)((long)&i._M_current + 4),
                     (operation_t *)((long)&i._M_current + 3),(error_code *)ips_local);
        }
        this->m_failures = this->m_failures + 1;
        retry_connection(this);
      }
      else {
        local_60._0_8_ =
             ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
             begin((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                   local_20._M_pi);
        __last = ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                 ::end((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                        *)local_20._M_pi);
        local_70 = this;
        local_68 = (per_timer_data *)__last;
        local_60._8_8_ =
             ::std::
             find_if<__gnu_cxx::__normal_iterator<boost::asio::ip::address_const*,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>>,libtorrent::aux::socks5::on_name_lookup(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)::__0>
                       ((__normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
                         )local_60._0_8_,
                        (__normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
                         )__last._M_current,(anon_class_8_1_8991fb9c_for__M_pred)this);
        __len = (socklen_t)__last._M_current;
        local_78._M_current =
             (address *)
             ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::end
                       ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                         *)local_20._M_pi);
        bVar2 = __gnu_cxx::operator==
                          ((__normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
                            *)(local_60 + 8),&local_78);
        if (bVar2) {
          bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
          if (bVar2) {
            paVar1 = this->m_alerts;
            listen_socket_handle::get_local_endpoint(&local_94,&this->m_listen_socket);
            local_95 = hostname_lookup;
            cat = boost::system::generic_category();
            boost::system::error_code::error_code((error_code *)&ec.cat_,0x71,cat);
            alert_manager::
            emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::operation_t,boost::system::error_code>
                      (paVar1,&local_94,&local_95,(error_code *)&ec.cat_);
          }
          this->m_failures = this->m_failures + 1;
          retry_connection(this);
        }
        else {
          addr = __gnu_cxx::
                 __normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
                 ::operator*((__normal_iterator<const_boost::asio::ip::address_*,_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_>
                              *)(local_60 + 8));
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&this->m_proxy_addr,addr);
          boost::system::error_code::error_code((error_code *)local_b8);
          bVar2 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(&this->m_proxy_addr);
          if (bVar2) {
            local_bc = (char  [4])boost::asio::ip::tcp::v4();
          }
          else {
            local_bc = (char  [4])boost::asio::ip::tcp::v6();
          }
          boost::asio::
          basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::open((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)&this->m_socks5_sock,local_bc,(int)local_b8);
          bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_b8);
          if (bVar2) {
            bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
            if (bVar2) {
              local_bd = sock_open;
              alert_manager::
              emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                        (this->m_alerts,&this->m_proxy_addr,&local_bd,(error_code *)local_b8);
            }
          }
          else {
            boost::asio::detail::socket_option::boolean<1,_9>::boolean(&local_c4,true);
            boost::asio::
            basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ::set_option<boost::asio::detail::socket_option::boolean<1,9>>
                      ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                        *)&this->m_socks5_sock,&local_c4,(error_code *)local_b8);
            bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_b8);
            if (bVar2) {
              bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
              if (bVar2) {
                local_c5 = sock_option;
                peVar3 = (error_code *)local_b8;
                alert_manager::
                emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                          (this->m_alerts,&this->m_proxy_addr,&local_c5,peVar3);
                __len = (socklen_t)peVar3;
              }
              boost::system::error_code::clear((error_code *)local_b8);
            }
            tcp_keepalive_idle::tcp_keepalive_idle(&local_cc,0x1e);
            boost::asio::
            basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::set_option<libtorrent::aux::tcp_keepalive_idle>
                      ((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        *)&this->m_socks5_sock,&local_cc,(error_code *)local_b8);
            bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_b8);
            if (bVar2) {
              bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
              if (bVar2) {
                local_cd = sock_option;
                peVar3 = (error_code *)local_b8;
                alert_manager::
                emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                          (this->m_alerts,&this->m_proxy_addr,&local_cd,peVar3);
                __len = (socklen_t)peVar3;
              }
              boost::system::error_code::clear((error_code *)local_b8);
            }
            tcp_keepalive_interval::tcp_keepalive_interval
                      ((tcp_keepalive_interval *)&bind_ep.impl_.data_.v6.sin6_scope_id,1);
            boost::asio::
            basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::set_option<libtorrent::aux::tcp_keepalive_interval>
                      ((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        *)&this->m_socks5_sock,
                       (tcp_keepalive_interval *)&bind_ep.impl_.data_.v6.sin6_scope_id,
                       (error_code *)local_b8);
            bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_b8);
            if (bVar2) {
              bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
              if (bVar2) {
                bind_ep.impl_.data_._23_1_ = 0x29;
                peVar3 = (error_code *)local_b8;
                alert_manager::
                emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                          (this->m_alerts,&this->m_proxy_addr,
                           (operation_t *)((long)&bind_ep.impl_.data_ + 0x17),peVar3);
                __len = (socklen_t)peVar3;
              }
              boost::system::error_code::clear((error_code *)local_b8);
            }
            listen_socket_handle::get_local_endpoint(&local_134,&this->m_listen_socket);
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_118,&local_134);
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                      ((basic_endpoint<boost::asio::ip::tcp> *)local_f4,&local_118,0);
            boost::asio::
            basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::bind((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)&this->m_socks5_sock,(int)local_f4,(sockaddr *)local_b8,__len);
            bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_b8);
            if (bVar2) {
              bVar2 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
              if (bVar2) {
                local_135 = sock_bind;
                alert_manager::
                emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code&>
                          (this->m_alerts,&this->m_proxy_addr,&local_135,(error_code *)local_b8);
              }
              this->m_failures = this->m_failures + 1;
              retry_connection(this);
            }
            else {
              local_178._16_8_ = on_connected;
              local_178._24_8_ = (wait_op *)0x0;
              self((socks5 *)local_178);
              ::std::
              bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
                        (&local_158,(offset_in_socks5_to_subr *)(local_178 + 0x10),
                         (shared_ptr<libtorrent::aux::socks5> *)local_178,
                         (_Placeholder<1> *)&::std::placeholders::_1);
              boost::asio::
              basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ::
              async_connect<std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                        ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                          *)&this->m_socks5_sock,&this->m_proxy_addr,&local_158);
              ::std::
              _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              ::~_Bind(&local_158);
              ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
                        ((shared_ptr<libtorrent::aux::socks5> *)local_178);
              local_19c = 10;
              ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        (local_198,&local_19c);
              ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::
              duration<long,std::ratio<1l,1l>,void>
                        (local_190,(duration<long,_std::ratio<1L,_1L>_> *)local_198);
              boost::asio::
              basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::expires_after(&this->m_timer,(duration *)local_190);
              local_1e0._16_8_ = on_connect_timeout;
              local_1e0._24_4_ = 0;
              local_1e0[0x1c] = '\0';
              local_1e0._29_3_ = 0;
              self((socks5 *)local_1e0);
              ::std::
              bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
                        ((type *)(local_1e0 + 0x20),(offset_in_socks5_to_subr *)(local_1e0 + 0x10),
                         (shared_ptr<libtorrent::aux::socks5> *)local_1e0,
                         (_Placeholder<1> *)&::std::placeholders::_1);
              boost::asio::
              basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ::
              async_wait<std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                        ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                          *)&this->m_timer,
                         (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                          *)(local_1e0 + 0x20));
              ::std::
              _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              ::~_Bind((_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                        *)(local_1e0 + 0x20));
              ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
                        ((shared_ptr<libtorrent::aux::socks5> *)local_1e0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void socks5::on_name_lookup(error_code const& e, std::vector<address> const& ips)
{
	COMPLETE_ASYNC("socks5::on_name_lookup");

	if (m_abort) return;

	if (e == boost::asio::error::operation_aborted) return;

	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_listen_socket.get_local_endpoint()
				, operation_t::hostname_lookup, e);
		++m_failures;
		retry_connection();
		return;
	}

	// only set up a SOCKS5 tunnel for sockets with the same address family
	// as the proxy
	// this is a hack to mitigate excessive SOCKS5 tunnels, until this can get
	// fixed properly.
	auto const i = std::find_if(ips.begin(), ips.end()
		, [&](address const& a) {
			return m_listen_socket.can_route(a);
		});

	if (i == ips.end())
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_listen_socket.get_local_endpoint()
				, operation_t::hostname_lookup
				, error_code(boost::system::errc::host_unreachable, generic_category()));
		++m_failures;
		retry_connection();
		return;
	}

	m_proxy_addr.address(*i);

	error_code ec;
	m_socks5_sock.open(aux::is_v4(m_proxy_addr) ? tcp::v4() : tcp::v6(), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_open, ec);
		return;
	}

	// enable keep-alives
	m_socks5_sock.set_option(boost::asio::socket_base::keep_alive(true), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option, ec);
		ec.clear();
	}

#if defined _WIN32 && !defined TORRENT_BUILD_SIMULATOR
	SOCKET sock = m_socks5_sock.native_handle();
	DWORD bytes = 0;
	tcp_keepalive timeout{};
	timeout.onoff = TRUE;
	timeout.keepalivetime = 30;
	timeout.keepaliveinterval = 30;
	auto const ret = WSAIoctl(sock, SIO_KEEPALIVE_VALS, &timeout, sizeof(timeout)
		, nullptr, 0, &bytes, nullptr, nullptr);
	if (ret != 0)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option
				, error_code(WSAGetLastError(), system_category()));
	}
#else
#if defined TORRENT_HAS_KEEPALIVE_IDLE
	// set keepalive timeouts
	m_socks5_sock.set_option(aux::tcp_keepalive_idle(30), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option, ec);
		ec.clear();
	}
#endif
#ifdef TORRENT_HAS_KEEPALIVE_INTERVAL
	m_socks5_sock.set_option(aux::tcp_keepalive_interval(1), ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_option, ec);
		ec.clear();
	}
#endif
#endif

	tcp::endpoint const bind_ep(m_listen_socket.get_local_endpoint().address(), 0);
	m_socks5_sock.bind(bind_ep, ec);
	if (ec)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_bind, ec);
		++m_failures;
		retry_connection();
		return;
	}

	// TODO: perhaps an attempt should be made to bind m_socks5_sock to the
	// device of m_listen_socket

	ADD_OUTSTANDING_ASYNC("socks5::on_connected");
	m_socks5_sock.async_connect(m_proxy_addr
		, std::bind(&socks5::on_connected, self(), _1));

	ADD_OUTSTANDING_ASYNC("socks5::on_connect_timeout");
	m_timer.expires_after(seconds(10));
	m_timer.async_wait(std::bind(&socks5::on_connect_timeout
		, self(), _1));
}